

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GIC.h
# Opt level: O1

void __thiscall
Gudhi::cover_complex::Cover_complex<std::vector<float,_std::allocator<float>_>_>::
compute_pairwise_distances<Gudhi::Euclidean_distance>
          (Cover_complex<std::vector<float,_std::allocator<float>_>_> *this)

{
  pointer pvVar1;
  pointer pvVar2;
  ostream *poVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  value_type vVar9;
  vector<double,_std::allocator<double>_> zeros;
  allocator_type local_5a;
  Euclidean_distance local_59;
  long local_58;
  long local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  std::vector<double,_std::allocator<double>_>::vector(&local_48,(long)this->num_points,&local_5a);
  if (0 < this->num_points) {
    iVar5 = 0;
    do {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&this->distances,&local_48);
      iVar5 = iVar5 + 1;
    } while (iVar5 < this->num_points);
  }
  if (this->verbose != false) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Computing distances...",0x16);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  uVar4 = (ulong)(uint)this->num_points;
  if (0 < this->num_points) {
    local_58 = 0;
    lVar7 = 0;
    do {
      local_50 = lVar7 + 1;
      iVar5 = ((int)local_50 * 100) / (int)uVar4;
      if ((this->verbose == true) && (iVar5 % 10 == 0)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"\r",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::clog,iVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
        std::ostream::flush();
      }
      lVar6 = lVar7;
      lVar8 = local_58;
      if (lVar7 < this->num_points) {
        do {
          pvVar1 = (this->point_cloud).
                   super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          vVar9 = Euclidean_distance::operator()
                            (&local_59,pvVar1 + lVar7,
                             (vector<float,_std::allocator<float>_> *)
                             ((long)&(pvVar1->super__Vector_base<float,_std::allocator<float>_>).
                                     _M_impl.super__Vector_impl_data + lVar8));
          pvVar2 = (this->distances).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          *(double *)
           (*(long *)&pvVar2[lVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + lVar6 * 8) = (double)vVar9;
          *(double *)
           (*(long *)((long)&(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data + lVar8) + lVar7 * 8) = (double)vVar9;
          lVar6 = lVar6 + 1;
          lVar8 = lVar8 + 0x18;
        } while ((int)lVar6 < this->num_points);
      }
      uVar4 = (ulong)this->num_points;
      local_58 = local_58 + 0x18;
      lVar7 = local_50;
    } while (local_50 < (long)uVar4);
  }
  if (this->verbose != false) {
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void compute_pairwise_distances(Distance ref_distance) {
    std::vector<double> zeros(this->num_points);
    for (int i = 0; i < this->num_points; i++) distances.push_back(zeros);
    if (verbose) std::clog << "Computing distances..." << std::endl;
    for (int i = 0; i < this->num_points; i++) {
      int state = 100 * (i + 1) / this->num_points;
      if (verbose && state % 10 == 0) std::clog << "\r" << state << "%" << std::flush;
      for (int j = i; j < this->num_points; j++) {
        double dis = ref_distance(point_cloud[i], point_cloud[j]);
        distances[i][j] = dis;
        distances[j][i] = dis;
      }
    }
    if (verbose) std::clog << std::endl;
  }